

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

void ** Extra_ArrayAlloc(int nCols,int nRows,int Size)

{
  void **ppvVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (((0 < nCols) && (0 < nRows)) && (0 < Size)) {
    uVar5 = (ulong)(uint)nCols;
    uVar4 = Size * nRows;
    ppvVar1 = (void **)malloc((uVar4 + 8) * uVar5);
    *ppvVar1 = ppvVar1 + uVar5;
    if (1 < nCols) {
      uVar2 = 1;
      uVar3 = uVar4;
      do {
        ppvVar1[uVar2] = (void *)((ulong)uVar3 + (long)*ppvVar1);
        uVar2 = uVar2 + 1;
        uVar3 = uVar3 + uVar4;
      } while (uVar5 != uVar2);
    }
    return ppvVar1;
  }
  __assert_fail("nCols > 0 && nRows > 0 && Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x375,"void **Extra_ArrayAlloc(int, int, int)");
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}